

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  size_type __n;
  long lVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  unsigned_long rows;
  float fVar5;
  undefined1 auVar6 [16];
  allocator_type local_741;
  vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
  minibatch;
  vector<dlib::sgd,_std::allocator<dlib::sgd>_> solvers;
  vector<unsigned_long,_std::allocator<unsigned_long>_> labels;
  matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  image;
  undefined1 local_6d0 [40];
  longlong local_6a8;
  size_t sStack_6a0;
  undefined4 local_698;
  undefined1 local_690 [20];
  undefined1 auStack_67c [12];
  undefined1 auStack_670 [20];
  storage_heap local_658;
  train_50 net;
  array<float,_100UL> times;
  
  setenv("CUDA_LAUNCH_BLOCKING","1",1);
  rows = 0xe0;
  if (argc < 2) {
    __n = 1;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&net,argv[1],(allocator<char> *)&times);
    __n = std::__cxx11::stoul((string *)&net,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&net);
    if (argc != 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&net,argv[2],(allocator<char> *)&times);
      rows = std::__cxx11::stoul((string *)&net,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&net);
    }
  }
  dlib::
  matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  ::matrix(&image,rows,rows);
  net._0_8_ = net._0_8_ & 0xffffffffff000000;
  dlib::
  assign_all_pixels<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::rgb_pixel>
            (&image,(rgb_pixel *)&net);
  std::
  vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
  ::vector(&minibatch,__n,&image,(allocator_type *)&net);
  local_690._0_16_ = ZEXT816(0) << 0x40;
  local_6d0._8_32_ = ZEXT1632(local_690._0_16_);
  local_6a8 = 0;
  sStack_6a0 = 0;
  local_6d0._0_8_ = &PTR__resizable_tensor_001fa338;
  local_698._0_1_ = true;
  local_698._1_1_ = true;
  local_698._2_1_ = false;
  local_698._3_1_ = false;
  local_690._16_4_ = 0;
  local_658 = (storage_heap)ZEXT1632(local_690._0_16_);
  auStack_67c = local_690._0_12_;
  auStack_670 = ZEXT420(0);
  lVar1 = std::chrono::_V2::steady_clock::now();
  dlib::add_loss_layer<$e8a4ea05$>::add_loss_layer(&net);
  lVar2 = std::chrono::_V2::steady_clock::now();
  poVar3 = std::operator<<((ostream *)&std::cout,"instantiation time: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(float)(lVar2 - lVar1) / 1e+06);
  poVar3 = std::operator<<(poVar3," ms");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::istream::get();
  dlib::add_layer<$93b2f74b$>::
  to_tensor<__gnu_cxx::__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
            ((add_layer<_93b2f74b_> *)
             net.subnetwork.subnetwork._M_t.super___uniq_ptr_impl<_f44a5e60_>._M_t.
             super__Tuple_impl<_c1d9bf73_>.super__Head_base<_635a13c5_>._M_head_impl,
             (__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
              )minibatch.
               super__Vector_base<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
              )minibatch.
               super__Vector_base<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,(resizable_tensor *)local_6d0);
  lVar1 = std::chrono::_V2::steady_clock::now();
  dlib::add_layer<$556ce9e5$>::forward(&net.subnetwork,(tensor *)local_6d0);
  lVar2 = std::chrono::_V2::steady_clock::now();
  poVar3 = std::operator<<((ostream *)&std::cout,"1st inference time: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(float)(lVar2 - lVar1) / 1e+06);
  poVar3 = std::operator<<(poVar3," ms");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"input shape: ");
  poVar3 = std::ostream::_M_insert<long_long>((longlong)poVar3);
  poVar3 = std::operator<<(poVar3,'x');
  poVar3 = std::ostream::_M_insert<long_long>((longlong)poVar3);
  poVar3 = std::operator<<(poVar3,'x');
  poVar3 = std::ostream::_M_insert<long_long>((longlong)poVar3);
  poVar3 = std::operator<<(poVar3,'x');
  poVar3 = std::ostream::_M_insert<long_long>((longlong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"parameters: ");
  dlib::count_parameters<_4f6b03b7_>(&net);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::istream::get();
  for (lVar1 = 0; lVar1 != 400; lVar1 = lVar1 + 4) {
    dlib::add_layer<$93b2f74b$>::
    to_tensor<__gnu_cxx::__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
              ((add_layer<_93b2f74b_> *)
               net.subnetwork.subnetwork._M_t.super___uniq_ptr_impl<_f44a5e60_>._M_t.
               super__Tuple_impl<_c1d9bf73_>.super__Head_base<_635a13c5_>._M_head_impl,
               (__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                )minibatch.
                 super__Vector_base<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                )minibatch.
                 super__Vector_base<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(resizable_tensor *)local_6d0);
    lVar2 = std::chrono::_V2::steady_clock::now();
    dlib::add_layer<$556ce9e5$>::forward(&net.subnetwork,(tensor *)local_6d0);
    lVar4 = std::chrono::_V2::steady_clock::now();
    fVar5 = (float)(lVar4 - lVar2) / 1e+06;
    poVar3 = std::operator<<((ostream *)&std::cout,"2nd inference time: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
    std::operator<<(poVar3," ms   \r");
    std::ostream::flush();
    *(float *)((long)times._M_elems + lVar1) = fVar5;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"\navg: ");
  lVar1 = *(long *)poVar3;
  fVar5 = 0.0;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 8) = 3;
  for (lVar1 = 0; lVar1 != 400; lVar1 = lVar1 + 4) {
    fVar5 = fVar5 + *(float *)((long)times._M_elems + lVar1);
  }
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5 / 100.0);
  poVar3 = std::operator<<(poVar3," ms");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::istream::get();
  dlib::add_loss_layer<$e8a4ea05$>::clean(&net);
  dlib::add_loss_layer<$e8a4ea05$>::~add_loss_layer(&net);
  net._0_8_ = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&labels,__n,(value_type_conflict2 *)&net,(allocator_type *)&times);
  dlib::add_loss_layer<$f418249$>::add_loss_layer((add_loss_layer<_f418249_> *)&net);
  auVar6 = ZEXT816(0) << 0x40;
  times._M_elems[10] = 0.0;
  times._M_elems[0xb] = 0.0;
  times._M_elems[0xc] = 0.0;
  times._M_elems[0xd] = 0.0;
  times._M_elems._8_32_ = ZEXT1632(auVar6);
  times._M_elems._0_8_ = &PTR__resizable_tensor_001fa338;
  times._M_elems[0xe] = 3.60134e-43;
  times._M_elems[0x14] = 0.0;
  times._M_elems[0x10] = (float)auVar6._0_4_;
  times._M_elems[0x11] = (float)auVar6._4_4_;
  times._M_elems[0x12] = (float)auVar6._8_4_;
  times._M_elems[0x13] = (float)auVar6._12_4_;
  times._M_elems._120_32_ = ZEXT1632(auVar6);
  times._M_elems._84_12_ = auVar6._0_12_;
  times._M_elems._96_20_ = ZEXT420(0);
  times._M_elems[0x26] = 0.0005;
  times._M_elems[0x27] = 0.9;
  std::vector<dlib::sgd,_std::allocator<dlib::sgd>_>::vector
            (&solvers,0xa9,(value_type *)&times,&local_741);
  dlib::resizable_tensor::~resizable_tensor((resizable_tensor *)&times);
  dlib::add_layer<$2522f887$>::
  to_tensor<__gnu_cxx::__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
            ((add_layer<_2522f887_> *)
             net.subnetwork.subnetwork._M_t.super___uniq_ptr_impl<_f44a5e60_>._M_t.
             super__Tuple_impl<_c1d9bf73_>.super__Head_base<_635a13c5_>._M_head_impl,
             (__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
              )minibatch.
               super__Vector_base<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
              )minibatch.
               super__Vector_base<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,(resizable_tensor *)local_6d0);
  dlib::add_loss_layer<$f418249$>::
  compute_loss<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ((add_loss_layer<_f418249_> *)&net,(tensor *)local_6d0,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )labels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start);
  dlib::add_layer<$9dce10a9$>::back_propagate_error
            ((add_layer<_9dce10a9_> *)&net.subnetwork,(tensor *)local_6d0,yes);
  dlib::add_loss_layer<$f418249$>::update_parameters<dlib::sgd>
            ((add_loss_layer<_f418249_> *)&net,&solvers,0.1);
  for (lVar1 = 0; lVar1 != 400; lVar1 = lVar1 + 4) {
    lVar2 = std::chrono::_V2::steady_clock::now();
    dlib::add_layer<$2522f887$>::
    to_tensor<__gnu_cxx::__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
              ((add_layer<_2522f887_> *)
               net.subnetwork.subnetwork._M_t.super___uniq_ptr_impl<_f44a5e60_>._M_t.
               super__Tuple_impl<_c1d9bf73_>.super__Head_base<_635a13c5_>._M_head_impl,
               (__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                )minibatch.
                 super__Vector_base<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                )minibatch.
                 super__Vector_base<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(resizable_tensor *)local_6d0);
    dlib::add_loss_layer<$f418249$>::
    compute_loss<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ((add_loss_layer<_f418249_> *)&net,(tensor *)local_6d0,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )labels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start);
    dlib::add_layer<$9dce10a9$>::back_propagate_error
              ((add_layer<_9dce10a9_> *)&net.subnetwork,(tensor *)local_6d0,yes);
    dlib::add_loss_layer<$f418249$>::update_parameters<dlib::sgd>
              ((add_loss_layer<_f418249_> *)&net,&solvers,0.1);
    lVar4 = std::chrono::_V2::steady_clock::now();
    fVar5 = (float)(lVar4 - lVar2) / 1e+06;
    poVar3 = std::operator<<((ostream *)&std::cout,"backward pass time: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
    std::operator<<(poVar3," ms   \r");
    std::ostream::flush();
    *(float *)((long)times._M_elems + lVar1) = fVar5;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"\navg: ");
  lVar1 = *(long *)poVar3;
  fVar5 = 0.0;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 8) = 3;
  for (lVar1 = 0; lVar1 != 400; lVar1 = lVar1 + 4) {
    fVar5 = fVar5 + *(float *)((long)times._M_elems + lVar1);
  }
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5 / 100.0);
  poVar3 = std::operator<<(poVar3," ms");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::istream::get();
  std::vector<dlib::sgd,_std::allocator<dlib::sgd>_>::~vector(&solvers);
  dlib::add_loss_layer<$f418249$>::~add_loss_layer((add_loss_layer<_f418249_> *)&net);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&labels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  dlib::resizable_tensor::~resizable_tensor((resizable_tensor *)local_6d0);
  std::
  vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
  ::~vector(&minibatch);
  dlib::row_major_layout::
  layout<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_5>::~layout
            (&image.data);
  return 0;
}

Assistant:

int main(const int argc, const char** argv)try
{
    setenv("CUDA_LAUNCH_BLOCKING", "1", 1);
    chrono::time_point<chrono::steady_clock> t0, t1;
    float duration{};

    size_t mini_batch_size = 1;
    size_t image_size = 224;
    if (argc > 1)
    {
        mini_batch_size = std::stoul(argv[1]);
    }
    if (argc > 2)
    {
        image_size = std::stoul(argv[2]);
    }

    // Create the images to test
    dlib::matrix<dlib::rgb_pixel> image(image_size, image_size);
    dlib::assign_all_pixels(image, dlib::rgb_pixel(0, 0, 0));
    const std::vector<dlib::matrix<dlib::rgb_pixel>> minibatch(mini_batch_size, image);

    // The input tensor of the network
    dlib::resizable_tensor x;

    {
        // Declare the network
        t0 = chrono::steady_clock::now();
        resnet::infer_50 net;
        t1 = chrono::steady_clock::now();
        duration = chrono::duration_cast<fms>(t1 - t0).count();
        std::cout << "instantiation time: " << duration << " ms" << std::endl;
        std::cin.get();

        // Convert them to a tensor for this network. This way we only measure inference and not
        // data transfer. In PyTorch, this would be: x = x.cuda()
        net.to_tensor(minibatch.begin(), minibatch.end(), x);
        t0 = chrono::steady_clock::now();
        net.forward(x);
        t1 = chrono::steady_clock::now();
        duration = chrono::duration_cast<fms>(t1 - t0).count();
        std::cout << "1st inference time: " << duration << " ms" << std::endl;
        std::cout << "input shape: " << x.num_samples() << 'x' << x.k() << 'x' << x.nr() << 'x'
                  << x.nc() << std::endl;
        std::cout << "parameters: " << dlib::count_parameters(net) << std::endl;
        std::cin.get();

        std::array<float, 100> times;
        for (auto& time : times)
        {
            net.to_tensor(minibatch.begin(), minibatch.end(), x);
            t0 = chrono::steady_clock::now();
            net.forward(x);
            t1 = chrono::steady_clock::now();
            duration = chrono::duration_cast<fms>(t1 - t0).count();
            std::cout << "2nd inference time: " << duration << " ms   \r" << std::flush;
            time = duration;
        }
        std::cout << "\navg: " << std::fixed << std::setprecision(3)
                  << std::accumulate(times.begin(), times.end(), 0.f, std::plus<float>()) /
                         times.size()
                  << " ms" << std::endl;
        std::cin.get();
        net.clean();
    }

    // Create some labels
    const std::vector<unsigned long> labels(mini_batch_size, 0);
    resnet::train_50 net;
    // measure backward pass
    std::vector<dlib::sgd> solvers(net.num_computational_layers, dlib::sgd(0.0005, 0.9));
    net.to_tensor(minibatch.begin(), minibatch.end(), x);
    net.compute_loss(x, labels.begin());
    net.back_propagate_error(x);
    net.update_parameters(solvers, 0.1);
    std::array<float, 100> times;
    for (auto& time : times)
    {
        t0 = chrono::steady_clock::now();
        net.to_tensor(minibatch.begin(), minibatch.end(), x);
        net.compute_loss(x, labels.begin());
        net.back_propagate_error(x);
        net.update_parameters(solvers, 0.1);
        t1 = chrono::steady_clock::now();
        duration = chrono::duration_cast<fms>(t1 - t0).count();
        std::cout << "backward pass time: " << duration << " ms   \r" << std::flush;
        time = duration;
    }
    std::cout << "\navg: " << std::fixed << std::setprecision(3)
              << std::accumulate(times.begin(), times.end(), 0.f, std::plus<float>()) /
                     times.size()
              << " ms" << std::endl;
    std::cin.get();

    return EXIT_SUCCESS;
}
catch (const std::exception& e)
{
    std::cout << e.what() << std::endl;
    return EXIT_FAILURE;
}